

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# powell.hpp
# Opt level: O0

double optimize(double initial,function<double_(double)> *loss)

{
  function<double_(double)> *pfVar1;
  double dVar2;
  double extraout_XMM0_Qa;
  double dVar3;
  double local_80;
  double fd;
  double fc;
  double d;
  double c;
  double gr;
  double d_2;
  double d_1;
  double fr;
  double fl;
  double r;
  double l;
  double f_initial;
  function<double_(double)> *loss_local;
  double initial_local;
  
  dVar2 = std::function<double_(double)>::operator()(loss,initial);
  r = initial - 1.0;
  fl = initial + 1.0;
  fr = std::function<double_(double)>::operator()(loss,r);
  d_1 = std::function<double_(double)>::operator()(loss,fl);
  d_2 = 1.0;
  while (fr <= dVar2) {
    r = r - d_2;
    fr = std::function<double_(double)>::operator()(loss,r);
    d_2 = d_2 * 2.0;
  }
  gr = 1.0;
  while (d_1 <= dVar2) {
    fl = gr + fl;
    d_1 = std::function<double_(double)>::operator()(loss,fl);
    gr = gr * 2.0;
  }
  dVar2 = sqrt(5.0);
  dVar2 = (dVar2 - 1.0) / 2.0;
  d = -(fl - r) * dVar2 + fl;
  fc = (fl - r) * dVar2 + r;
  fd = std::function<double_(double)>::operator()(loss,d);
  pfVar1 = loss;
  local_80 = std::function<double_(double)>::operator()(loss,fc);
  while (std::abs((int)pfVar1), 1e-05 < extraout_XMM0_Qa) {
    if (local_80 <= fd) {
      r = d;
      d = fc;
      fd = local_80;
      fc = -(fl - fc) * dVar2 + fl;
      pfVar1 = loss;
      local_80 = std::function<double_(double)>::operator()(loss,fc);
    }
    else {
      fl = fc;
      fc = d;
      local_80 = fd;
      d = (d - r) * dVar2 + r;
      pfVar1 = loss;
      fd = std::function<double_(double)>::operator()(loss,d);
    }
  }
  dVar2 = std::function<double_(double)>::operator()(loss,(r + fl) / 2.0);
  dVar3 = std::function<double_(double)>::operator()(loss,initial);
  initial_local = initial;
  if (dVar2 <= dVar3) {
    initial_local = (r + fl) / 2.0;
  }
  return initial_local;
}

Assistant:

double optimize(double initial, std::function<double(double)> loss)
{
	// determine search interval
	double f_initial = loss(initial);
	double l = initial-1, r = initial+1;
	double fl = loss(l), fr = loss(r);
	for (double d=1; fl <= f_initial; d*=2) {
		l -= d;
		fl = loss(l);
	}
	for (double d=1; fr <= f_initial; d*=2) {
		r += d;
		fr = loss(r);
	}
	// Golden-section search
	const double gr = (std::sqrt(5.0) - 1) / 2;
    double c = r - (r-l) * gr;
    double d = l + (r-l) * gr;
    double fc = loss(c);
    double fd = loss(d);
    while (std::abs(c - d) > 1e-5) {
        if (fc < fd)
        {
            r = d;
            d = c;
            fd = fc;
            c = l + (d-l) * gr;
            fc = loss(c);
        }
        else
        {
            l = c;
            c = d;
            fc = fd;
            d = r - (r-c) * gr;
            fd = loss(d);
        }
    }
    // check if we have really done at least some optimization
    if (loss((l+r)/2) > loss(initial))
    	return initial;
    return (l+r)/2;
}